

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

_Bool duckdb_je_ckh_new(tsd_t *tsd,ckh_t *ckh,size_t minitems,ckh_hash_t *ckh_hash,
                       ckh_keycomp_t *keycomp)

{
  long *plVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  arena_t *paVar5;
  rtree_ctx_t *rtree_ctx;
  byte bVar6;
  uintptr_t uVar7;
  uint uVar8;
  ulong uVar9;
  rtree_t *prVar10;
  size_t usize;
  _Bool _Var11;
  rtree_metadata_t rVar12;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  ckh->prng_state = 0x2a;
  ckh->count = 0;
  uVar8 = 0xffffffff;
  paVar5 = (arena_t *)0x1;
  do {
    bVar6 = (char)uVar8 + 3;
    uVar8 = uVar8 + 1;
  } while ((ulong)(1L << (bVar6 & 0x3f)) < (minitems + (minitems % 3 ^ 3)) / 3 << 2);
  ckh->lg_minbuckets = uVar8;
  ckh->lg_curbuckets = uVar8;
  ckh->hash = ckh_hash;
  ckh->keycomp = keycomp;
  uVar4 = 0x10L << (bVar6 & 0x3f);
  if (uVar4 < 0x3801) {
    uVar8 = (int)uVar4 + 0x3fU & 0x7fc0;
    if (uVar8 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar8 >> 3]];
    }
    else {
      uVar4 = (ulong)uVar8 * 2 - 1;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar4 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
      usize = ~uVar4 + (ulong)uVar8 & uVar4;
    }
    uVar9 = 0x4000;
    if (usize < 0x4000) goto LAB_00e79013;
  }
  else {
    uVar9 = 0x4000;
    if (0x4000 < uVar4) {
      if (uVar4 < 0x7000000000000001) {
        uVar9 = (0x20L << (bVar6 & 0x3f)) - 1;
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        paVar5 = (arena_t *)(-1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f));
        uVar9 = ~(ulong)paVar5 + uVar4 & (ulong)paVar5;
      }
      else {
        uVar9 = 0;
      }
      if (uVar9 < uVar4) {
        return true;
      }
    }
  }
  usize = 0;
  if (!CARRY8(duckdb_je_sz_large_pad,uVar9)) {
    usize = uVar9;
  }
LAB_00e79013:
  if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
    _Var11 = true;
  }
  else {
    paVar5 = arena_ichoose(tsd,paVar5);
    uVar7 = 1;
    rtree_ctx = (rtree_ctx_t *)
                duckdb_je_arena_palloc
                          ((tsdn_t *)tsd,paVar5,usize,0x40,true,usize < 0x3801,(tcache_t *)0x0);
    _Var11 = rtree_ctx == (rtree_ctx_t *)0x0;
    if (!_Var11) {
      if (tsd == (tsd_t *)0x0) {
        prVar10 = (rtree_t *)&rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar10);
      }
      else {
        prVar10 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1c8,(tsdn_t *)tsd,prVar10,rtree_ctx,uVar7);
      uVar7 = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
      pvVar2 = duckdb_je_arenas[uVar7].repr;
      if (tsd == (tsd_t *)0x0) {
        prVar10 = (rtree_t *)&rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar10);
      }
      else {
        prVar10 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rVar12 = rtree_metadata_read((tsdn_t *)tsd,prVar10,rtree_ctx,uVar7);
      LOCK();
      plVar1 = (long *)((long)pvVar2 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar12.szind];
      UNLOCK();
    }
    ckh->tab = (ckhc_t *)rtree_ctx;
  }
  return _Var11;
}

Assistant:

bool
ckh_new(tsd_t *tsd, ckh_t *ckh, size_t minitems, ckh_hash_t *ckh_hash,
    ckh_keycomp_t *keycomp) {
	bool ret;
	size_t mincells, usize;
	unsigned lg_mincells;

	assert(minitems > 0);
	assert(ckh_hash != NULL);
	assert(keycomp != NULL);

#ifdef CKH_COUNT
	ckh->ngrows = 0;
	ckh->nshrinks = 0;
	ckh->nshrinkfails = 0;
	ckh->ninserts = 0;
	ckh->nrelocs = 0;
#endif
	ckh->prng_state = 42; /* Value doesn't really matter. */
	ckh->count = 0;

	/*
	 * Find the minimum power of 2 that is large enough to fit minitems
	 * entries.  We are using (2+,2) cuckoo hashing, which has an expected
	 * maximum load factor of at least ~0.86, so 0.75 is a conservative load
	 * factor that will typically allow mincells items to fit without ever
	 * growing the table.
	 */
	assert(LG_CKH_BUCKET_CELLS > 0);
	mincells = ((minitems + (3 - (minitems % 3))) / 3) << 2;
	for (lg_mincells = LG_CKH_BUCKET_CELLS;
	    (ZU(1) << lg_mincells) < mincells;
	    lg_mincells++) {
		/* Do nothing. */
	}
	ckh->lg_minbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->lg_curbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->hash = ckh_hash;
	ckh->keycomp = keycomp;

	usize = sz_sa2u(sizeof(ckhc_t) << lg_mincells, CACHELINE);
	if (unlikely(usize == 0 || usize > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto label_return;
	}
	ckh->tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE, true,
	    NULL, true, arena_ichoose(tsd, NULL));
	if (ckh->tab == NULL) {
		ret = true;
		goto label_return;
	}

	ret = false;
label_return:
	return ret;
}